

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

int __thiscall GrcSymbolTableEntry::UserDefinableSlotAttrIndex(GrcSymbolTableEntry *this)

{
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar2 = (this->m_staFieldName)._M_string_length;
  bVar10 = 4 < uVar2;
  iVar5 = -1;
  if (bVar10) {
    pcVar3 = (this->m_staFieldName)._M_dataplus._M_p;
    bVar6 = pcVar3[4] - 0x30;
    bVar8 = 0;
    if (bVar6 < 10) {
      bVar8 = bVar6;
    }
    iVar7 = (int)(char)bVar8;
    if (bVar6 < 10) {
      uVar4 = 5;
      iVar5 = iVar7;
      do {
        iVar7 = iVar5;
        uVar9 = uVar4;
        if (uVar2 == uVar9) break;
        cVar1 = pcVar3[uVar9];
        uVar4 = uVar9 + 1;
        iVar5 = (int)cVar1 + iVar7 * 10 + -0x30;
      } while ((byte)(cVar1 - 0x30U) < 10);
      bVar10 = uVar9 < uVar2;
    }
    iVar5 = -1;
    if (!bVar10) {
      iVar5 = iVar7 + -1;
    }
  }
  return iVar5;
}

Assistant:

int GrcSymbolTableEntry::UserDefinableSlotAttrIndex()
{
	Assert(IsUserDefinableSlotAttr());
	int nRet = 0;
	for (size_t ich = 4; ich < m_staFieldName.length(); ich++)
	{
		char ch = m_staFieldName[ich];
		if (ch < '0')
			return -1;
		if (ch > '9')
			return -1;
		nRet = (nRet * 10) + (ch - '0');
	}
	return nRet - 1;	// 0-based
}